

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

int __thiscall Imf_3_3::TimeCode::binaryGroup(TimeCode *this,int group)

{
  uint uVar1;
  char *text;
  int minBit_00;
  int in_ESI;
  ArgExc *in_RDI;
  int maxBit;
  int minBit;
  
  if ((0 < in_ESI) && (in_ESI < 9)) {
    minBit_00 = (in_ESI + -1) * 4;
    uVar1 = anon_unknown_1::bitField
                      (*(uint *)&(in_RDI->super_BaseExc).field_0x4,minBit_00,minBit_00 + 3);
    return uVar1;
  }
  text = (char *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(in_RDI,text);
  __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

int
TimeCode::binaryGroup (int group) const
{
    if (group < 1 || group > 8)
        throw IEX_NAMESPACE::ArgExc (
            "Cannot extract binary group from time code "
            "user data.  Group number is out of range.");

    int minBit = 4 * (group - 1);
    int maxBit = minBit + 3;
    return int (bitField (_user, minBit, maxBit));
}